

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

SQInteger __thiscall SQSharedState::CollectGarbage(SQSharedState *this,SQVM *vm)

{
  SQCollectable_conflict *pSVar1;
  SQUnsignedInteger SVar2;
  SQCollectable_conflict *nx;
  SQCollectable_conflict *t;
  SQCollectable_conflict *tchain;
  SQInteger n;
  SQVM *vm_local;
  SQSharedState *this_local;
  
  tchain = (SQCollectable_conflict *)0x0;
  t = (SQCollectable_conflict *)0x0;
  n = (SQInteger)vm;
  vm_local = (SQVM *)this;
  RunMark(this,vm,&t);
  nx = this->_gc_chain;
  if (nx != (SQCollectable_conflict *)0x0) {
    (nx->super_SQRefCounted)._uiRef = (nx->super_SQRefCounted)._uiRef + 1;
    while (nx != (SQCollectable_conflict *)0x0) {
      (*(nx->super_SQRefCounted)._vptr_SQRefCounted[5])();
      pSVar1 = nx->_next;
      if (pSVar1 != (SQCollectable_conflict *)0x0) {
        (pSVar1->super_SQRefCounted)._uiRef = (pSVar1->super_SQRefCounted)._uiRef + 1;
      }
      SVar2 = (nx->super_SQRefCounted)._uiRef - 1;
      (nx->super_SQRefCounted)._uiRef = SVar2;
      if (SVar2 == 0) {
        (*(nx->super_SQRefCounted)._vptr_SQRefCounted[2])();
      }
      tchain = (SQCollectable_conflict *)
               ((long)&(tchain->super_SQRefCounted)._vptr_SQRefCounted + 1);
      nx = pSVar1;
    }
  }
  for (nx = t; nx != (SQCollectable_conflict *)0x0; nx = nx->_next) {
    SQCollectable::UnMark((SQCollectable *)nx);
  }
  this->_gc_chain = t;
  return (SQInteger)tchain;
}

Assistant:

SQInteger SQSharedState::CollectGarbage(SQVM *vm)
{
    SQInteger n = 0;
    SQCollectable *tchain = NULL;

    RunMark(vm,&tchain);

    SQCollectable *t = _gc_chain;
    SQCollectable *nx = NULL;
    if(t) {
        t->_uiRef++;
        while(t) {
            t->Finalize();
            nx = t->_next;
            if(nx) nx->_uiRef++;
            if(--t->_uiRef == 0)
                t->Release();
            t = nx;
            n++;
        }
    }

    t = tchain;
    while(t) {
        t->UnMark();
        t = t->_next;
    }
    _gc_chain = tchain;

    return n;
}